

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::process_comments(CTcTokenizer *this,size_t start_ofs)

{
  undefined1 *puVar1;
  tok_embed_ctx *ptVar2;
  byte bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  wchar_t wVar9;
  int iVar10;
  wchar_t wVar11;
  size_t sVar12;
  long lVar13;
  tok_embed_level *ptVar14;
  uint ch;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  utf8_ptr *p;
  ulong uVar18;
  utf8_ptr *p_00;
  
  p = (utf8_ptr *)((this->linebuf_).buf_ + start_ofs);
  wVar9 = utf8_ptr::s_getch((char *)p);
  if (wVar9 == L'\0') {
    bVar8 = true;
  }
  else {
    ptVar2 = &this->comment_in_embedding_;
    bVar8 = false;
    p_00 = p;
    do {
      wVar9 = utf8_ptr::s_getch((char *)p_00);
      if ((this->str_->field_0x28 & 2) == 0) {
        if (this->in_quote_ == L'\0') {
          if (wVar9 == L'\\') {
            bVar8 = true;
            if (ptVar2->level == 0) {
              wVar9 = L'\\';
            }
            else {
LAB_0021d2f8:
              if ((wVar9 == L'>') && (((this->comment_in_embedding_).s)->parens == 0)) {
                wVar11 = utf8_ptr::s_getch_at((char *)p_00,1);
                wVar9 = L'>';
                if (wVar11 == L'>') {
                  uVar16 = ptVar2->level;
                  if (uVar16 == 0) {
                    this->in_quote_ = L'\0';
                    this->in_triple_ = 0;
LAB_0021d62c:
                    ptVar14 = (tok_embed_level *)0x0;
LAB_0021d63c:
                    (this->comment_in_embedding_).s = ptVar14;
                  }
                  else {
                    ptVar14 = (this->comment_in_embedding_).s;
                    this->in_quote_ = ptVar14->qu;
                    this->in_triple_ = ptVar14->triple;
                    if ((int)uVar16 < 1) {
LAB_0021d632:
                      ptVar14 = ptVar2->stk + (long)(int)uVar16 + -1;
                      goto LAB_0021d63c;
                    }
                    uVar15 = uVar16 - 1;
                    ptVar2->level = uVar15;
                    if (uVar15 == 0) goto LAB_0021d62c;
                    bVar6 = uVar16 < 0xb;
                    uVar16 = uVar15;
                    if (bVar6) goto LAB_0021d632;
                  }
                  uVar16 = ((*(byte *)&p_00->p_ >> 5 & 1) != 0) + 1 &
                           (uint)(*(byte *)&p_00->p_ >> 7) * 3;
                  *(char *)&p->p_ = '>';
                  goto LAB_0021d667;
                }
              }
            }
          }
          else {
            if ((0x7f < (uint)wVar9) || (iVar10 = isspace(wVar9), iVar10 == 0)) {
              bVar8 = false;
            }
            if ((wVar9 == L'\"') || (wVar9 == L'\'')) {
              this->in_quote_ = wVar9;
              iVar10 = count_quotes(p_00,wVar9);
              this->in_triple_ = (uint)(2 < iVar10);
              if (2 < iVar10) {
                lVar13 = -2;
                do {
                  p_00 = (utf8_ptr *)
                         ((long)&p_00->p_ +
                         (ulong)(((*(byte *)&p_00->p_ >> 5 & 1) != 0) + 1 &
                                (uint)(*(byte *)&p_00->p_ >> 7) * 3) + 1);
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 0);
                sVar12 = utf8_ptr::s_putch((char *)p,wVar9);
                pcVar17 = (char *)((long)&p->p_ + sVar12);
                sVar12 = utf8_ptr::s_putch(pcVar17,wVar9);
                p = (utf8_ptr *)(pcVar17 + sVar12);
              }
            }
            else if (wVar9 == L'/') {
              wVar11 = utf8_ptr::s_getch_at((char *)p_00,1);
              if (wVar11 == L'*') {
                puVar1 = &this->str_->field_0x28;
                *puVar1 = *puVar1 | 2;
LAB_0021d610:
                wVar9 = L' ';
              }
              else {
                wVar9 = L'/';
                if (wVar11 == L'/') {
                  *(char *)&p->p_ = '\0';
                  return;
                }
              }
            }
            else {
              if (wVar9 < L'\t') goto LAB_0021d610;
              if ((wVar9 & 0x7ffffffeU) == 0x28 && ptVar2->level != 0) {
                ptVar14 = (this->comment_in_embedding_).s;
                ptVar14->parens = ptVar14->parens + (uint)(wVar9 == L'(') * 2 + -1;
                if (ptVar14->parens < 0) {
                  ((this->comment_in_embedding_).s)->parens = 0;
                }
              }
              else if (ptVar2->level != 0) goto LAB_0021d2f8;
            }
          }
        }
        else if (wVar9 == L'\\') {
          p_00 = (utf8_ptr *)
                 ((long)&p_00->p_ +
                 (ulong)(((*(byte *)&p_00->p_ >> 5 & 1) != 0) + 1 &
                        (uint)(*(byte *)&p_00->p_ >> 7) * 3) + 1);
          *(char *)&p->p_ = '\\';
          p = (utf8_ptr *)((long)&p->p_ + 1);
          wVar9 = utf8_ptr::s_getch((char *)p_00);
          if (((this->in_triple_ != 0) && (wVar9 == this->in_quote_)) &&
             (iVar10 = count_quotes(p_00,wVar9), 1 < iVar10)) {
            uVar16 = iVar10 + 1;
            do {
              sVar12 = utf8_ptr::s_putch((char *)p,wVar9);
              p = (utf8_ptr *)((long)&p->p_ + sVar12);
              p_00 = (utf8_ptr *)
                     ((long)&p_00->p_ +
                     (ulong)(((*(byte *)&p_00->p_ >> 5 & 1) != 0) + 1 &
                            (uint)(*(byte *)&p_00->p_ >> 7) * 3) + 1);
              uVar16 = uVar16 - 1;
            } while (2 < uVar16);
          }
        }
        else if (wVar9 == this->in_quote_) {
          if (this->in_triple_ == 0) {
            this->in_quote_ = L'\0';
          }
          else {
            iVar10 = count_quotes(p_00,wVar9);
            if (2 < iVar10) {
              iVar10 = iVar10 + -1;
              do {
                sVar12 = utf8_ptr::s_putch((char *)p,wVar9);
                p = (utf8_ptr *)((long)&p->p_ + sVar12);
                p_00 = (utf8_ptr *)
                       ((long)&p_00->p_ +
                       (ulong)(((*(byte *)&p_00->p_ >> 5 & 1) != 0) + 1 &
                              (uint)(*(byte *)&p_00->p_ >> 7) * 3) + 1);
                iVar10 = iVar10 + -1;
              } while (iVar10 != 0);
              this->in_quote_ = L'\0';
            }
          }
        }
        else if (wVar9 == L'<') {
          wVar11 = utf8_ptr::s_getch_at((char *)p_00,1);
          wVar9 = L'<';
          if (wVar11 == L'<') {
            bVar3 = *(byte *)&p_00->p_;
            iVar10 = ptVar2->level;
            lVar13 = (long)iVar10;
            if (lVar13 < 10) {
              (this->comment_in_embedding_).s = (this->comment_in_embedding_).stk + lVar13;
              (this->comment_in_embedding_).stk[lVar13].parens = 0;
              uVar4 = this->in_quote_;
              uVar5 = this->in_triple_;
              (this->comment_in_embedding_).stk[lVar13].endtok =
                   (uint)(uVar4 == 0x22) * 4 + TOKT_SSTR_END;
              ptVar14 = (this->comment_in_embedding_).stk + lVar13;
              ptVar14->qu = uVar4;
              ptVar14->triple = uVar5;
              iVar10 = (this->comment_in_embedding_).level;
            }
            bVar7 = bVar3 >> 7;
            uVar16 = (uint)bVar7 + (uint)bVar7 * 2 & ((bVar3 >> 5 & 1) != 0) + 1;
            (this->comment_in_embedding_).level = iVar10 + 1;
            this->in_quote_ = L'\0';
            *(char *)&p->p_ = '<';
LAB_0021d667:
            p_00 = (utf8_ptr *)((long)&p_00->p_ + (ulong)uVar16 + 1);
            p = (utf8_ptr *)((long)&p->p_ + 1);
          }
        }
        sVar12 = utf8_ptr::s_putch((char *)p,wVar9);
        p = (utf8_ptr *)((long)&p->p_ + sVar12);
      }
      else if (wVar9 == L'/') {
        wVar9 = utf8_ptr::s_getch_at((char *)p_00,1);
        if ((wVar9 == L'*') && ((G_prs->field_0xec & 4) == 0)) {
          log_warning(0x274d);
        }
      }
      else if ((wVar9 == L'*') && (wVar9 = utf8_ptr::s_getch_at((char *)p_00,1), wVar9 == L'/')) {
        p_00 = (utf8_ptr *)
               ((long)&p_00->p_ +
               (ulong)(((*(byte *)&p_00->p_ >> 5 & 1) != 0) + 1 &
                      (uint)(*(byte *)&p_00->p_ >> 7) * 3) + 1);
        puVar1 = &this->str_->field_0x28;
        *puVar1 = *puVar1 & 0xfd;
      }
      p_00 = (utf8_ptr *)
             ((long)&p_00->p_ +
             (ulong)(((*(byte *)&p_00->p_ >> 5 & 1) != 0) + 1 & (uint)(*(byte *)&p_00->p_ >> 7) * 3)
             + 1);
      wVar9 = utf8_ptr::s_getch((char *)p_00);
    } while (wVar9 != L'\0');
    bVar8 = !bVar8;
  }
  pcVar17 = (this->linebuf_).buf_;
  uVar18 = (long)p - (long)pcVar17;
  (this->linebuf_).buf_len_ = uVar18;
  if (uVar18 < (this->linebuf_).buf_size_) {
    pcVar17[uVar18] = '\0';
  }
  if (bVar8) {
    return;
  }
  log_warning(0x274b);
  return;
}

Assistant:

void CTcTokenizer::process_comments(size_t start_ofs)
{
    utf8_ptr src;
    utf8_ptr dst;
    
    /* we haven't found a backslash followed by trailing space yet */
    int trailing_sp_after_bs = FALSE;

    /* 
     *   Scan the line.  When inside a comment, replace each character of
     *   the comment with a space.  When outside comments, simply copy
     *   characters intact.
     *   
     *   Note that we need a separate src and dst pointer, because the
     *   character length of the original and replaced characters may
     *   change.  Fortunately, the length will never do anything but
     *   shrink or stay the same, since the only change we make is to
     *   insert spaces, which are always one byte apiece in UTF-8; we can
     *   therefore update the buffer in place.  
     */
    for (src.set(linebuf_.get_buf() + start_ofs),
         dst.set(linebuf_.get_buf() + start_ofs) ;
         src.getch() != '\0' ; src.inc())
    {
        /* get the current character */
        wchar_t cur = src.getch();

        /* check to see if we're in a comment */
        if (str_->is_in_comment())
        {
            /* 
             *   check to see if the comment is ending, or if we have an
             *   apparent nested comment (which isn't allowed)
             */
            if (cur == '*' && src.getch_at(1) == '/')
            {
                /* 
                 *   skip an extra character of the source - we'll skip
                 *   one in the main loop, so we only need to skip one
                 *   more now 
                 */
                src.inc();
                
                /* we're no longer in a comment */
                str_->set_in_comment(FALSE);
            }
            else if (cur == '/' && src.getch_at(1) == '*')
            {
                /* looks like a nested comment - warn about it */
                if (!G_prs->get_syntax_only())
                    log_warning(TCERR_NESTED_COMMENT);
            }

            /* continue without copying anything from inside the comment */
            continue;
        }
        else if (in_quote_ != '\0')
        {
            /* see what we have */
            if (cur == '\\')
            {
                /* 
                 *   It's a backslash sequence -- copy the backslash to
                 *   the output, and skip it.  Note that we don't have to
                 *   worry about the line ending with a backslash, since
                 *   the line reader will already have considered that to
                 *   be a line splice.  
                 */
                src.inc();
                dst.setch(cur);

                /* get the next character, so we copy it directly */
                cur = src.getch();

                /* 
                 *   if we're in a triple-quoted string, and this is an
                 *   escaped quote, the backslash escapes a whole run of
                 *   consecutive quotes that follow 
                 */
                if (in_triple_ && cur == in_quote_)
                {
                    /* copy and skip any run of quotes, minus the last one */
                    for (int qcnt = count_quotes(&src, cur) ; qcnt > 1 ;
                         dst.setch(cur), src.inc(), --qcnt) ;
                }
            }
            else if (cur == in_quote_)
            {
                /* This is the close quote.  Check for triple quotes. */
                if (in_triple_)
                {
                    /* triple-quoted - we need three quotes in a row */
                    int qcnt = count_quotes(&src, cur);
                    if (qcnt >= 3)
                    {
                        /* copy and skip all but the last in the run */
                        for (int i = 1 ; i < qcnt ; ++i, src.inc())
                            dst.setch(cur);

                        /* close the string */
                        in_quote_ = '\0';
                    }
                }
                else
                {
                    /* regular string, so it ends at the matching quote */
                    in_quote_ = '\0';
                }
            }
            else if (cur == '<' && src.getch_at(1) == '<')
            {
                /* 
                 *   it's an embedded expression starting point - skip the
                 *   first of the '<' characters (the enclosing loop will
                 *   skip the second one)
                 */
                src.inc();

                /* we're in an embedding now */
                comment_in_embedding_.start_expr(in_quote_, in_triple_, FALSE);

                /* the string is done for now */
                in_quote_ = '\0';

                /* copy the extra '<' to the output */
                dst.setch('<');
            }
        }
        else
        {
            /*
             *   Monitor the stream for a backslash followed by trailing
             *   spaces.  If this is a backslash, note that we might have a
             *   backslash with trailing spaces; if it's a space, we might
             *   still have this, so leave the flag alone; if it's anything
             *   else, clear the flag, since we've found something other
             *   than backslashes and spaces.  
             */
            if (cur == '\\')
                trailing_sp_after_bs = TRUE;
            else if (!is_space(cur))
                trailing_sp_after_bs = FALSE;
            
            /* check to see if we're starting a comment */
            if (cur == '/')
            {
                switch(src.getch_at(1))
                {
                case '*':
                    /* note that we're starting a comment */
                    str_->set_in_comment(TRUE);

                    /* 
                     *   replace the starting slash with a space - this
                     *   will effectively replace the entire comment with
                     *   a single space, since we won't copy anything else
                     *   from inside the comment 
                     */
                    cur = ' ';
                    break;

                case '/':
                    /* 
                     *   comment to end of line - we can terminate the
                     *   line at the opening slash and return immediately,
                     *   because the entire rest of the line is to be
                     *   ignored 
                     */
                    dst.setch('\0');
                    return;

                default:
                    /* not a comment - copy it as-is */
                    break;
                }
            }
            else if (cur == '"' || cur == '\'')
            {
                /* it's the start of a new string */
                in_quote_ = cur;

                /* check for triple quotes */
                in_triple_ = (count_quotes(&src, cur) >= 3);

                /* if in triple quotes, copy and skip the extra two qutoes */
                if (in_triple_)
                {
                    src.inc_by(2);
                    dst.setch(cur);
                    dst.setch(cur);
                }
            }
            else if (cur < 0x09)
            {
                /* 
                 *   it's a special flag character - we need to guarantee
                 *   that this character never occurs in input (it
                 *   shouldn't anyway, since it's a control character), so
                 *   translate it to a space 
                 */
                cur = ' ';
            }
            else if (comment_in_embedding_.in_expr()
                     && (cur == '(' || cur == ')'))
            {
                /* adjust the paren level in an embedded expression */
                comment_in_embedding_.parens(cur == '(' ? 1 : -1);
            }
            else if (comment_in_embedding_.in_expr()
                     && comment_in_embedding_.parens() == 0
                     && cur == '>' && src.getch_at(1) == '>')
            {
                /* it's the end of an embedded expression */
                in_quote_ = comment_in_embedding_.qu();
                in_triple_ = comment_in_embedding_.triple();
                comment_in_embedding_.end_expr();

                /* skip the extra '>' and copy it to the output */
                src.inc();
                dst.setch('>');
            }
        }

        /* set the current character in the output */
        dst.setch(cur);
    }

    /* set the updated line buffer length */
    linebuf_.set_text_len(dst.getptr() - linebuf_.get_buf());

    /* 
     *   if we found a backslash with nothing following but whitespace, flag
     *   a warning, since they might have meant the backslash as a line
     *   continuation signal, but we're not interpreting it that way because
     *   of the trailing whitespace 
     */
    if (trailing_sp_after_bs)
        log_warning(TCERR_TRAILING_SP_AFTER_BS);
}